

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O1

bool __thiscall mcsFile::toHex(mcsFile *this,char *p2,uchar *result)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  uint i;
  long lVar6;
  long lVar7;
  uchar digit [2];
  byte abStack_32 [2];
  
  *result = '\0';
  lVar7 = 4;
  lVar6 = 0;
  bVar5 = false;
  bVar4 = 0;
  do {
    cVar1 = p2[lVar6];
    bVar2 = cVar1 - 0x30;
    abStack_32[lVar6] = bVar2;
    if (9 < bVar2) {
      iVar3 = toupper((int)cVar1);
      bVar2 = (char)iVar3 + 0xbf;
      abStack_32[lVar6] = bVar2;
      if (5 < bVar2) {
        return bVar5;
      }
      abStack_32[lVar6] = (char)iVar3 - 0x37;
    }
    bVar4 = bVar4 | abStack_32[lVar6] << ((byte)lVar7 & 0x1f);
    *result = bVar4;
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + -4;
    bVar5 = lVar7 != 0;
  } while (lVar7 == 0);
  return bVar5;
}

Assistant:

bool mcsFile::toHex(const char *p2, unsigned char &result) const
{
    const unsigned int NUM_DIGITS = 2;
    unsigned char digit[NUM_DIGITS];
    result = 0;
    for (unsigned int i = 0; i < NUM_DIGITS; i++) {
        digit[i] = p2[i]-'0';
        if (digit[i] > 9) {
            digit[i] = toupper(p2[i])-'A';
            if (digit[i] > 5) return false;
            digit[i] += 10;
        }
        result |= digit[i] << (4*(NUM_DIGITS-i-1));
    }
    return true;
}